

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::location_contents(Parser *this,Location *loc)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  csubstr cVar6;
  char msg [39];
  basic_substring<char> local_48;
  char local_38 [32];
  
  uVar5 = (loc->super_LineCol).offset;
  uVar4 = (this->m_buf).len;
  if (uVar4 <= uVar5) {
    builtin_strncpy(local_38,"oc.offset < m_buf.len)",0x17);
    local_48.str = (char *)0x6166206b63656863;
    local_48.len._0_1_ = 'i';
    local_48.len._1_1_ = 'l';
    local_48.len._2_1_ = 'e';
    local_48.len._3_1_ = 'd';
    local_48.len._4_1_ = ':';
    local_48.len._5_1_ = ' ';
    local_48.len._6_1_ = '(';
    local_48.len._7_1_ = 'l';
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        cVar6 = (csubstr)(*pcVar1)();
        return cVar6;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7f8e) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x7f8e) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_48,0x27,LVar2,(this->m_stack).m_callbacks.m_user_data);
    uVar5 = (loc->super_LineCol).offset;
    uVar4 = (this->m_buf).len;
  }
  if (uVar5 <= uVar4) {
    basic_substring<char>::basic_substring(&local_48,(this->m_buf).str + uVar5,uVar4 - uVar5);
    cVar6.len = local_48.len;
    cVar6.str = local_48.str;
    return cVar6;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar1 = (code *)swi(3);
      cVar6 = (csubstr)(*pcVar1)();
      return cVar6;
    }
  }
  handle_error(0x24bbea,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

csubstr Parser::location_contents(Location const& loc) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, loc.offset < m_buf.len);
    return m_buf.sub(loc.offset);
}